

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O3

void __thiscall
duckdb::ArgMinMaxStateBase::AssignValue<duckdb::string_t>
          (ArgMinMaxStateBase *this,string_t *target,string_t new_value)

{
  undefined4 uVar1;
  undefined4 *__dest;
  
  if ((0xc < *(uint *)this) && (*(void **)(this + 4) != (void *)0x0)) {
    operator_delete__(*(void **)(this + 4));
  }
  if ((uint)target < 0xd) {
    *(string_t **)this = target;
    __dest = new_value.value._0_8_;
  }
  else {
    __dest = (undefined4 *)operator_new__((ulong)target & 0xffffffff);
    switchD_00b041bd::default(__dest,new_value.value._0_8_,(ulong)target & 0xffffffff);
    uVar1 = *__dest;
    *(uint *)this = (uint)target;
    *(undefined4 *)(this + 2) = uVar1;
  }
  *(undefined4 **)(this + 4) = __dest;
  return;
}

Assistant:

void ArgMinMaxStateBase::AssignValue(string_t &target, string_t new_value) {
	DestroyValue(target);
	if (new_value.IsInlined()) {
		target = new_value;
	} else {
		// non-inlined string, need to allocate space for it
		auto len = new_value.GetSize();
		auto ptr = new char[len];
		memcpy(ptr, new_value.GetData(), len);

		target = string_t(ptr, UnsafeNumericCast<uint32_t>(len));
	}
}